

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalTypeOptimization.cpp
# Opt level: O3

void __thiscall
wasm::anon_unknown_226::GlobalTypeOptimization::run(GlobalTypeOptimization *this,Module *module)

{
  StructValuesMap<wasm::(anonymous_namespace)::FieldInfo> *this_00;
  __node_base_ptr p_Var1;
  __node_base_ptr p_Var2;
  __node_base_ptr *this_01;
  ulong *puVar3;
  byte bVar4;
  PassRunner *pPVar5;
  pointer puVar6;
  Global *pGVar7;
  pointer puVar8;
  pointer ppEVar9;
  pointer puVar10;
  DataSegment *pDVar11;
  pointer pFVar12;
  long lVar13;
  _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>,_true>_>_>
  *p_Var14;
  _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>_>,_false>_>_>
  *p_Var15;
  _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>,_true>_>_>
  *p_Var16;
  bool bVar17;
  StructValues<wasm::(anonymous_namespace)::FieldInfo> *pSVar18;
  ulong uVar19;
  __node_type *p_Var20;
  undefined1 auVar21 [8];
  Struct *pSVar22;
  StructValues<wasm::(anonymous_namespace)::FieldInfo> *pSVar23;
  mapped_type *this_02;
  pointer pFVar24;
  undefined1 toSuperTypes;
  _Hash_node_base *p_Var25;
  pointer pFVar26;
  ulong uVar27;
  ElementSegment *pEVar28;
  Module *pMVar29;
  __node_ptr __n;
  __node_ptr p_Var30;
  uint uVar31;
  unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *curr_4;
  ulong __new_size;
  pointer puVar32;
  pointer ppEVar33;
  __node_base_ptr p_Var34;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *curr;
  long *plVar35;
  pointer puVar36;
  pointer puVar37;
  unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *curr_1;
  undefined8 *puVar38;
  _Hash_node_base *p_Var39;
  __node_base_ptr p_Var40;
  undefined1 local_448 [16];
  _Alloc_hider local_438;
  size_type local_430;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_428;
  Walker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>
  local_418;
  FunctionStructValuesMap<wasm::(anonymous_namespace)::FieldInfo> *local_340;
  __node_base_ptr *local_338;
  undefined1 local_2c0 [8];
  FunctionStructValuesMap<wasm::(anonymous_namespace)::FieldInfo> functionNewInfos;
  TypeHierarchyPropagator<wasm::(anonymous_namespace)::FieldInfo> propagator;
  FunctionStructValuesMap<wasm::(anonymous_namespace)::FieldInfo> functionSetGetInfos;
  __buckets_alloc_type __alloc;
  Walker<FieldRemover,_wasm::Visitor<FieldRemover,_void>_> local_1d0;
  __node_base_ptr local_f8;
  undefined1 local_f0 [8];
  type subs;
  undefined1 local_90 [8];
  StructValuesMap<wasm::(anonymous_namespace)::FieldInfo> subSupers;
  undefined1 local_40 [8];
  HeapType type;
  
  if (((module->features).features & 0x400) == 0) {
    return;
  }
  if ((((this->super_Pass).runner)->options).closedWorld == false) {
    Fatal::Fatal((Fatal *)local_448);
    Fatal::operator<<((Fatal *)local_448,(char (*) [28])"GTO requires --closed-world");
    Fatal::~Fatal((Fatal *)local_448);
  }
  StructUtils::FunctionStructValuesMap<wasm::(anonymous_namespace)::FieldInfo>::
  FunctionStructValuesMap
            ((FunctionStructValuesMap<wasm::(anonymous_namespace)::FieldInfo> *)local_2c0,module);
  this_01 = &propagator.subTypes.typeSubTypes._M_h._M_single_bucket;
  StructUtils::FunctionStructValuesMap<wasm::(anonymous_namespace)::FieldInfo>::
  FunctionStructValuesMap
            ((FunctionStructValuesMap<wasm::(anonymous_namespace)::FieldInfo> *)this_01,module);
  local_438._M_p = (pointer)&local_428;
  local_430 = 0;
  local_428._M_local_buf[0] = '\0';
  local_418.replacep = (Expression **)0x0;
  local_418.stack.usedFixed = 0;
  local_418.stack.flexible.
  super__Vector_base<wasm::Walker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task,_std::allocator<wasm::Walker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_418.stack.flexible.
  super__Vector_base<wasm::Walker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task,_std::allocator<wasm::Walker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_418.stack.flexible.
  super__Vector_base<wasm::Walker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task,_std::allocator<wasm::Walker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_418.currFunction = (Function *)0x0;
  local_418.currModule = (Module *)0x0;
  local_448._0_8_ = &PTR__WalkerPass_00d73b40;
  local_448._8_8_ = (this->super_Pass).runner;
  local_340 = (FunctionStructValuesMap<wasm::(anonymous_namespace)::FieldInfo> *)local_2c0;
  local_338 = this_01;
  WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>_>
  ::run((WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>_>
         *)local_448,module);
  pPVar5 = (this->super_Pass).runner;
  subSupers.
  super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
  ._M_h._M_single_bucket = (__node_base_ptr)this;
  if ((PassRunner *)local_448._8_8_ != pPVar5 && (PassRunner *)local_448._8_8_ != (PassRunner *)0x0)
  {
LAB_0070d51c:
    __assert_fail("(!runner || runner == runner_) && \"Pass already had a runner\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/pass.h"
                  ,0x1dc,"void wasm::Pass::setPassRunner(PassRunner *)");
  }
  puVar6 = (module->globals).
           super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_448._8_8_ = pPVar5;
  local_418.currModule = module;
  for (puVar36 = (module->globals).
                 super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar36 != puVar6; puVar36 = puVar36 + 1
      ) {
    pGVar7 = (puVar36->_M_t).super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>
             ._M_t.super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
             super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
    if (*(char **)((long)&(pGVar7->super_Importable).module + 8) == (char *)0x0) {
      Walker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>
      ::walk(&local_418,&pGVar7->init);
    }
  }
  puVar32 = (module->elementSegments).
            super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar8 = (module->elementSegments).
           super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar32 != puVar8) {
    do {
      pEVar28 = (puVar32->_M_t).
                super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                ._M_t.
                super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
      if (pEVar28->offset != (Expression *)0x0) {
        Walker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>
        ::walk(&local_418,&pEVar28->offset);
        pEVar28 = (puVar32->_M_t).
                  super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                  .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
      }
      ppEVar9 = *(pointer *)
                 ((long)&(pEVar28->data).
                         super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                         ._M_impl + 8);
      for (ppEVar33 = (pEVar28->data).
                      super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                      _M_impl.super__Vector_impl_data._M_start; ppEVar33 != ppEVar9;
          ppEVar33 = ppEVar33 + 1) {
        functionSetGetInfos.
        super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
        ._M_h._M_single_bucket = (__node_base_ptr)*ppEVar33;
        Walker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>
        ::walk(&local_418,
               (Expression **)
               &functionSetGetInfos.
                super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
                ._M_h._M_single_bucket);
      }
      puVar32 = puVar32 + 1;
    } while (puVar32 != puVar8);
  }
  puVar10 = (module->dataSegments).
            super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar37 = (module->dataSegments).
                 super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar37 != puVar10;
      puVar37 = puVar37 + 1) {
    pDVar11 = (puVar37->_M_t).
              super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>._M_t
              .super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>.
              super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl;
    if (pDVar11->offset != (Expression *)0x0) {
      Walker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>
      ::walk(&local_418,&pDVar11->offset);
    }
  }
  local_418.currModule = (Module *)0x0;
  if (functionSetGetInfos.
      super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
      ._M_h._M_bucket_count != 0) {
    this_00 = (StructValuesMap<wasm::(anonymous_namespace)::FieldInfo> *)
              (subSupers.
               super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
               ._M_h._M_single_bucket + 6);
    plVar35 = (long *)functionSetGetInfos.
                      super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
                      ._M_h._M_bucket_count;
    do {
      for (puVar38 = (undefined8 *)plVar35[4]; puVar38 != (undefined8 *)0x0;
          puVar38 = (undefined8 *)*puVar38) {
        if (puVar38[3] != puVar38[2]) {
          uVar31 = 1;
          uVar27 = 0;
          do {
            pSVar18 = StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>::
                      operator[](this_00,(HeapType)puVar38[1]);
            pFVar12 = (pSVar18->
                      super_vector<wasm::(anonymous_namespace)::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::FieldInfo>_>
                      ).
                      super__Vector_base<wasm::(anonymous_namespace)::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::FieldInfo>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if ((ulong)((long)(pSVar18->
                              super_vector<wasm::(anonymous_namespace)::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::FieldInfo>_>
                              ).
                              super__Vector_base<wasm::(anonymous_namespace)::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::FieldInfo>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar12 >> 1) <=
                uVar27) goto LAB_0070d4de;
            lVar13 = puVar38[2];
            uVar19 = puVar38[3] - lVar13 >> 1;
            if (uVar19 <= uVar27) {
              __assert_fail("index < this->size()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/struct-utils.h"
                            ,0x27,
                            "const T &wasm::StructUtils::StructValues<wasm::(anonymous namespace)::FieldInfo>::operator[](size_t) const [T = wasm::(anonymous namespace)::FieldInfo]"
                           );
            }
            bVar4 = *(byte *)(lVar13 + 1 + uVar27 * 2);
            if ((pFVar12[uVar27].hasWrite == false) && ((*(byte *)(lVar13 + uVar27 * 2) & 1) != 0))
            {
              pFVar12[uVar27].hasWrite = true;
            }
            if ((pFVar12[uVar27].hasRead == false) && ((bVar4 & 1) != 0)) {
              pFVar12[uVar27].hasRead = true;
            }
            uVar27 = (ulong)uVar31;
            uVar31 = uVar31 + 1;
          } while (uVar27 < uVar19);
        }
      }
      plVar35 = (long *)*plVar35;
    } while (plVar35 != (long *)0x0);
  }
  pMVar29 = module;
  SubTypes::SubTypes((SubTypes *)
                     &functionNewInfos.
                      super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
                      ._M_h._M_single_bucket,module);
  p_Var1 = subSupers.
           super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
           ._M_h._M_single_bucket;
  p_Var20 = (__node_type *)
            &subSupers.
             super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
             ._M_h._M_rehash_policy._M_next_resize;
  local_90 = (undefined1  [8])0x0;
  p_Var39 = subSupers.
            super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
            ._M_h._M_single_bucket[7]._M_nxt;
  subSupers.
  super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
  ._M_h._M_bucket_count = 0;
  p_Var25 = subSupers.
            super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
            ._M_h._M_single_bucket[9]._M_nxt;
  subSupers.
  super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
  ._M_h._M_element_count =
       (size_type)
       subSupers.
       super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
       ._M_h._M_single_bucket[10]._M_nxt;
  subSupers.
  super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
  ._M_h._M_rehash_policy._0_8_ =
       subSupers.
       super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
       ._M_h._M_single_bucket[0xb]._M_nxt;
  subSupers.
  super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
  ._M_h._M_rehash_policy._M_next_resize = 0;
  subSupers.
  super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
  ._M_h._M_buckets = &p_Var39->_M_nxt;
  subSupers.
  super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
  ._M_h._M_before_begin._M_nxt = p_Var25;
  if (p_Var39 != (_Hash_node_base *)&DAT_00000001) {
    p_Var20 = (__node_type *)
              __gnu_cxx::new_allocator<std::__detail::_Hash_node_base_*>::allocate
                        ((new_allocator<std::__detail::_Hash_node_base_*> *)
                         &functionSetGetInfos.
                          super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
                          ._M_h._M_single_bucket,(size_type)p_Var39,(void *)0x0);
    pMVar29 = (Module *)0x0;
    memset(p_Var20,0,(long)p_Var39 << 3);
  }
  toSuperTypes = SUB81(p_Var25,0);
  p_Var39 = p_Var1[8]._M_nxt;
  local_90 = (undefined1  [8])p_Var20;
  if (p_Var39 != (_Hash_node_base *)0x0) {
    subSupers.
    super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
    ._M_h._M_bucket_count =
         (size_type)
         std::__detail::
         _AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<wasm::HeapType_const,wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>>,true>>>
         ::operator()((_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<wasm::HeapType_const,wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>>,true>>>
                       *)(p_Var39 + 1),
                      (pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>
                       *)pMVar29);
    p_Var25 = p_Var39[5]._M_nxt;
    (((__node_type *)
     subSupers.
     super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
     ._M_h._M_bucket_count)->
    super__Hash_node_value<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>,_true>
    ).super__Hash_node_code_cache<true>._M_hash_code = (size_t)p_Var25;
    ((_Hash_node_base *)local_90)
    [(ulong)p_Var25 %
     (ulong)subSupers.
            super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
            ._M_h._M_buckets]._M_nxt =
         (_Hash_node_base *)
         &subSupers.
          super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
          ._M_h._M_bucket_count;
    auVar21 = local_90;
    p_Var20 = (__node_type *)
              subSupers.
              super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
              ._M_h._M_bucket_count;
    for (p_Var39 = p_Var39->_M_nxt; toSuperTypes = SUB81(auVar21,0),
        p_Var39 != (_Hash_node_base *)0x0; p_Var39 = p_Var39->_M_nxt) {
      auVar21 = (undefined1  [8])
                std::__detail::
                _AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<wasm::HeapType_const,wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>>,true>>>
                ::operator()((_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<wasm::HeapType_const,wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>>,true>>>
                              *)(p_Var39 + 1),
                             (pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>
                              *)pMVar29);
      (p_Var20->super__Hash_node_base)._M_nxt = (_Hash_node_base *)auVar21;
      p_Var25 = p_Var39[5]._M_nxt;
      (((__node_type *)auVar21)->
      super__Hash_node_value<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>,_true>
      ).super__Hash_node_code_cache<true>._M_hash_code = (size_t)p_Var25;
      uVar27 = (ulong)p_Var25 %
               (ulong)subSupers.
                      super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
                      ._M_h._M_buckets;
      if (((_Hash_node_base *)local_90)[uVar27]._M_nxt == (_Hash_node_base *)0x0) {
        ((_Hash_node_base *)local_90)[uVar27]._M_nxt = &p_Var20->super__Hash_node_base;
      }
      p_Var20 = (__node_type *)auVar21;
    }
  }
  StructUtils::TypeHierarchyPropagator<wasm::(anonymous_namespace)::FieldInfo>::propagate
            ((TypeHierarchyPropagator<wasm::(anonymous_namespace)::FieldInfo> *)
             &functionNewInfos.
              super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
              ._M_h._M_single_bucket,
             (StructValuesMap<wasm::(anonymous_namespace)::FieldInfo> *)local_90,true,
             (bool)toSuperTypes);
  p_Var40 = subSupers.
            super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
            ._M_h._M_single_bucket;
  subs.
  super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
  ._M_h._M_buckets =
       &(subSupers.
         super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
         ._M_h._M_single_bucket[7]._M_nxt)->_M_nxt;
  subs.
  super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
  ._M_h._M_bucket_count =
       (size_type)
       subSupers.
       super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
       ._M_h._M_single_bucket[8]._M_nxt;
  subs.
  super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
  ._M_h._M_before_begin._M_nxt =
       subSupers.
       super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
       ._M_h._M_single_bucket[9]._M_nxt;
  subs.
  super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
  ._M_h._M_element_count =
       (size_type)
       subSupers.
       super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
       ._M_h._M_single_bucket[10]._M_nxt;
  subs.
  super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
  ._M_h._M_rehash_policy._0_8_ =
       subSupers.
       super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
       ._M_h._M_single_bucket[0xb]._M_nxt;
  subs.
  super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
  ._M_h._M_rehash_policy._M_next_resize = 0;
  p_Var1 = subSupers.
           super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
           ._M_h._M_single_bucket + 0xc;
  local_f0 = (undefined1  [8])
             subSupers.
             super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
             ._M_h._M_single_bucket[6]._M_nxt;
  if (p_Var1 == subSupers.
                super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
                ._M_h._M_single_bucket[6]._M_nxt) {
    subs.
    super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
    ._M_h._M_rehash_policy._M_next_resize = (size_t)p_Var1->_M_nxt;
    local_f0 = (undefined1  [8])
               &subs.
                super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
                ._M_h._M_rehash_policy._M_next_resize;
  }
  p_Var2 = subSupers.
           super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
           ._M_h._M_single_bucket + 8;
  if ((_Hash_node_base *)
      subs.
      super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
      ._M_h._M_bucket_count != (_Hash_node_base *)0x0) {
    *(size_type **)
     ((long)local_f0 +
     ((ulong)((_Hash_node_base *)
             (subs.
              super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
              ._M_h._M_bucket_count + 0x28))->_M_nxt %
     (ulong)subs.
            super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
            ._M_h._M_buckets) * 8) =
         &subs.
          super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
          ._M_h._M_bucket_count;
  }
  p_Var40[0xb]._M_nxt = (_Hash_node_base *)0x0;
  p_Var40[0xc]._M_nxt = (_Hash_node_base *)0x0;
  p_Var40[7]._M_nxt = (_Hash_node_base *)&DAT_00000001;
  p_Var40[6]._M_nxt = p_Var1;
  p_Var2->_M_nxt = (_Hash_node_base *)0x0;
  p_Var40[9]._M_nxt = (_Hash_node_base *)0x0;
  pMVar29 = (Module *)local_f0;
  StructUtils::TypeHierarchyPropagator<wasm::(anonymous_namespace)::FieldInfo>::propagate
            ((TypeHierarchyPropagator<wasm::(anonymous_namespace)::FieldInfo> *)
             &functionNewInfos.
              super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
              ._M_h._M_single_bucket,
             (StructValuesMap<wasm::(anonymous_namespace)::FieldInfo> *)pMVar29,false,
             SUB81(local_f0,0));
  if (functionNewInfos.
      super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
      ._M_h._M_single_bucket !=
      (__node_base_ptr)
      propagator.subTypes.types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    subs.
    super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
    ._M_h._M_single_bucket = p_Var40 + 0xd;
    p_Var34 = functionNewInfos.
              super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
              ._M_h._M_single_bucket;
    do {
      local_40 = (undefined1  [8])p_Var34->_M_nxt;
      bVar17 = HeapType::isStruct((HeapType *)local_40);
      if (bVar17) {
        pSVar22 = HeapType::getStruct((HeapType *)local_40);
        pSVar18 = StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>::operator[]
                            ((StructValuesMap<wasm::(anonymous_namespace)::FieldInfo> *)local_90,
                             (HeapType)local_40);
        pSVar23 = StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>::operator[]
                            ((StructValuesMap<wasm::(anonymous_namespace)::FieldInfo> *)local_f0,
                             (HeapType)local_40);
        pFVar26 = (pSVar22->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pFVar24 = (pSVar22->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        if (pFVar24 == pFVar26) {
          uVar27 = 0;
          pFVar26 = pFVar24;
        }
        else {
          uVar31 = 1;
          uVar19 = 0;
          do {
            __new_size = (ulong)uVar31;
            if (pFVar26[uVar19].mutable_ != Immutable) {
              pFVar12 = (pSVar18->
                        super_vector<wasm::(anonymous_namespace)::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::FieldInfo>_>
                        ).
                        super__Vector_base<wasm::(anonymous_namespace)::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::FieldInfo>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              if ((ulong)((long)(pSVar18->
                                super_vector<wasm::(anonymous_namespace)::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::FieldInfo>_>
                                ).
                                super__Vector_base<wasm::(anonymous_namespace)::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::FieldInfo>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar12 >> 1) <=
                  uVar19) goto LAB_0070d4de;
              if (pFVar12[uVar19].hasWrite == false) {
                this_02 = std::__detail::
                          _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::vector<bool,_std::allocator<bool>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<bool,_std::allocator<bool>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::vector<bool,_std::allocator<bool>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<bool,_std::allocator<bool>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                        *)subs.
                                          super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
                                          ._M_h._M_single_bucket,(key_type *)local_40);
                std::vector<bool,_std::allocator<bool>_>::resize(this_02,__new_size,false);
                puVar3 = (this_02->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                         (uVar31 - 1 >> 6);
                *puVar3 = *puVar3 | 1L << ((byte)uVar19 & 0x3f);
                pFVar26 = (pSVar22->fields).
                          super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                          super__Vector_impl_data._M_start;
                pFVar24 = (pSVar22->fields).
                          super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                          super__Vector_impl_data._M_finish;
              }
            }
            uVar27 = (long)pFVar24 - (long)pFVar26 >> 4;
            uVar31 = uVar31 + 1;
            uVar19 = __new_size;
          } while (__new_size < uVar27);
        }
        pMVar29 = (Module *)0x0;
        type.id._4_4_ = 0;
        if (pFVar24 != pFVar26) {
          uVar19 = 0;
          do {
            pMVar29 = (Module *)
                      (pSVar18->
                      super_vector<wasm::(anonymous_namespace)::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::FieldInfo>_>
                      ).
                      super__Vector_base<wasm::(anonymous_namespace)::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::FieldInfo>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if ((ulong)((long)(pSVar18->
                              super_vector<wasm::(anonymous_namespace)::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::FieldInfo>_>
                              ).
                              super__Vector_base<wasm::(anonymous_namespace)::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::FieldInfo>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar29 >> 1) <=
                uVar19) goto LAB_0070d4de;
            if (*(char *)((long)&(((unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
                                    *)&pMVar29->exports)->_M_h)._M_buckets + uVar19 * 2 + 1) == '\0'
               ) {
              pMVar29 = (Module *)((long)&type.id + 4);
              std::
              _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
              ::_M_insert_unique<unsigned_int_const&>
                        ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                          *)&functionSetGetInfos.
                             super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
                             ._M_h._M_single_bucket,(uint *)pMVar29);
              uVar19 = (ulong)type.id._4_4_;
              pFVar26 = (pSVar22->fields).
                        super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                        super__Vector_impl_data._M_start;
              pFVar24 = (pSVar22->fields).
                        super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                        super__Vector_impl_data._M_finish;
            }
            type.id._4_4_ = (int)uVar19 + 1;
            uVar19 = (ulong)type.id._4_4_;
            uVar27 = (long)pFVar24 - (long)pFVar26 >> 4;
          } while (uVar19 < uVar27);
        }
        p_Var40 = subSupers.
                  super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
                  ._M_h._M_single_bucket;
        if (0 < (int)(uint)uVar27) {
          uVar27 = (ulong)((uint)uVar27 & 0x7fffffff);
          do {
            uVar19 = uVar27 - 1;
            pFVar12 = (pSVar23->
                      super_vector<wasm::(anonymous_namespace)::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::FieldInfo>_>
                      ).
                      super__Vector_base<wasm::(anonymous_namespace)::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::FieldInfo>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if ((ulong)((long)(pSVar23->
                              super_vector<wasm::(anonymous_namespace)::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::FieldInfo>_>
                              ).
                              super__Vector_base<wasm::(anonymous_namespace)::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::FieldInfo>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar12 >> 1) <=
                uVar19) {
LAB_0070d4de:
              __assert_fail("index < this->size()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/struct-utils.h"
                            ,0x22,
                            "T &wasm::StructUtils::StructValues<wasm::(anonymous namespace)::FieldInfo>::operator[](size_t) [T = wasm::(anonymous namespace)::FieldInfo]"
                           );
            }
            if ((pFVar12[uVar19].hasRead != false) || (pFVar12[uVar19].hasWrite != false)) break;
            type.id._4_4_ = (uint)uVar19;
            pMVar29 = (Module *)((long)&type.id + 4);
            std::
            _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
            ::_M_insert_unique<unsigned_int>
                      ((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                        *)&functionSetGetInfos.
                           super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
                           ._M_h._M_single_bucket,(uint *)pMVar29);
            bVar17 = 1 < uVar27;
            uVar27 = uVar19;
          } while (bVar17);
        }
        std::
        _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
        ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                     *)&functionSetGetInfos.
                        super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
                        ._M_h._M_single_bucket);
      }
      p_Var34 = p_Var34 + 1;
    } while (p_Var34 !=
             (__node_base_ptr)
             propagator.subTypes.types.
             super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
             super__Vector_impl_data._M_start);
  }
  if (p_Var40[0x17]._M_nxt == (_Hash_node_base *)0x0) {
    p_Var16 = (_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>,_true>_>_>
               *)subs.
                 super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
                 ._M_h._M_bucket_count;
    if (p_Var40[0x10]._M_nxt == (_Hash_node_base *)0x0) goto joined_r0x0070d2f5;
  }
  else {
    local_1d0.replacep = (Expression **)0x0;
    local_1d0.stack.usedFixed = 0;
    local_1d0.stack.flexible.
    super__Vector_base<wasm::Walker<FieldRemover,_wasm::Visitor<FieldRemover,_void>_>::Task,_std::allocator<wasm::Walker<FieldRemover,_wasm::Visitor<FieldRemover,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1d0.stack.flexible.
    super__Vector_base<wasm::Walker<FieldRemover,_wasm::Visitor<FieldRemover,_void>_>::Task,_std::allocator<wasm::Walker<FieldRemover,_wasm::Visitor<FieldRemover,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1d0.stack.flexible.
    super__Vector_base<wasm::Walker<FieldRemover,_wasm::Visitor<FieldRemover,_void>_>::Task,_std::allocator<wasm::Walker<FieldRemover,_wasm::Visitor<FieldRemover,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1d0.currFunction = (Function *)0x0;
    local_1d0.currModule = (Module *)0x0;
    functionSetGetInfos.
    super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
    ._M_h._M_single_bucket = (__node_base_ptr)&PTR__WalkerPass_00d73b98;
    p_Var39 = p_Var40[1]._M_nxt;
    pMVar29 = module;
    local_f8 = p_Var40;
    WalkerPass<wasm::PostWalker<FieldRemover,_wasm::Visitor<FieldRemover,_void>_>_>::run
              ((WalkerPass<wasm::PostWalker<FieldRemover,_wasm::Visitor<FieldRemover,_void>_>_> *)
               &functionSetGetInfos.
                super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
                ._M_h._M_single_bucket,module);
    if (p_Var39 != p_Var40[1]._M_nxt && p_Var39 != (_Hash_node_base *)0x0) goto LAB_0070d51c;
    puVar6 = (module->globals).
             super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_1d0.currModule = module;
    for (puVar36 = (module->globals).
                   super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar36 != puVar6;
        puVar36 = puVar36 + 1) {
      pMVar29 = (Module *)
                (puVar36->_M_t).
                super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
                super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
      if (*(Expression **)
           &((vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
              *)((long)&pMVar29->functions + 8))->
            super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
          == (Expression *)0x0) {
        pMVar29 = (Module *)((long)&pMVar29->globals + 0x10);
        Walker<FieldRemover,_wasm::Visitor<FieldRemover,_void>_>::walk
                  (&local_1d0,(Expression **)pMVar29);
      }
    }
    puVar32 = (module->elementSegments).
              super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar8 = (module->elementSegments).
             super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar32 != puVar8) {
      do {
        pMVar29 = (Module *)
                  (puVar32->_M_t).
                  super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                  .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
        if (((_Hash_node_code_cache<true> *)((long)&pMVar29->functions + 0x10))->_M_hash_code != 0)
        {
          Walker<FieldRemover,_wasm::Visitor<FieldRemover,_void>_>::walk
                    (&local_1d0,(Expression **)((long)&pMVar29->functions + 0x10));
          pMVar29 = (Module *)
                    (puVar32->_M_t).
                    super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                    .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
        }
        puVar6 = *(pointer *)
                  ((long)&(pMVar29->globals).
                          super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                  + 0x10);
        for (puVar36 = *(pointer *)
                        ((long)&(pMVar29->globals).
                                super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                        + 8); puVar36 != puVar6; puVar36 = puVar36 + 1) {
          local_40 = *(undefined1 (*) [8])
                      &(puVar36->_M_t).
                       super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t;
          pMVar29 = (Module *)local_40;
          Walker<FieldRemover,_wasm::Visitor<FieldRemover,_void>_>::walk
                    (&local_1d0,(Expression **)local_40);
        }
        puVar32 = puVar32 + 1;
        p_Var40 = subSupers.
                  super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
                  ._M_h._M_single_bucket;
      } while (puVar32 != puVar8);
    }
    puVar10 = (module->dataSegments).
              super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar37 = (module->dataSegments).
                   super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar37 != puVar10;
        puVar37 = puVar37 + 1) {
      pMVar29 = (Module *)
                (puVar37->_M_t).
                super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>.
                _M_t.
                super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                .super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl;
      if (*(long *)&(pMVar29->globals).
                    super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                    ._M_impl.super__Vector_impl_data != 0) {
        pMVar29 = (Module *)&pMVar29->globals;
        Walker<FieldRemover,_wasm::Visitor<FieldRemover,_void>_>::walk
                  (&local_1d0,(Expression **)pMVar29);
      }
    }
    local_1d0.currModule = (Module *)0x0;
    if (local_1d0.stack.flexible.
        super__Vector_base<wasm::Walker<FieldRemover,_wasm::Visitor<FieldRemover,_void>_>::Task,_std::allocator<wasm::Walker<FieldRemover,_wasm::Visitor<FieldRemover,_void>_>::Task>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      pMVar29 = (Module *)
                ((long)local_1d0.stack.flexible.
                       super__Vector_base<wasm::Walker<FieldRemover,_wasm::Visitor<FieldRemover,_void>_>::Task,_std::allocator<wasm::Walker<FieldRemover,_wasm::Visitor<FieldRemover,_void>_>::Task>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage -
                (long)local_1d0.stack.flexible.
                      super__Vector_base<wasm::Walker<FieldRemover,_wasm::Visitor<FieldRemover,_void>_>::Task,_std::allocator<wasm::Walker<FieldRemover,_wasm::Visitor<FieldRemover,_void>_>::Task>_>
                      ._M_impl.super__Vector_impl_data._M_start);
      operator_delete(local_1d0.stack.flexible.
                      super__Vector_base<wasm::Walker<FieldRemover,_wasm::Visitor<FieldRemover,_void>_>::Task,_std::allocator<wasm::Walker<FieldRemover,_wasm::Visitor<FieldRemover,_void>_>::Task>_>
                      ._M_impl.super__Vector_impl_data._M_start,(ulong)pMVar29);
    }
    functionSetGetInfos.
    super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
    ._M_h._M_single_bucket = (__node_base_ptr)&PTR__Pass_00d722d8;
    p_Var16 = (_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>,_true>_>_>
               *)subs.
                 super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
                 ._M_h._M_bucket_count;
    if (p_Var40[0x10]._M_nxt == (_Hash_node_base *)0x0 &&
        p_Var40[0x17]._M_nxt == (_Hash_node_base *)0x0) goto joined_r0x0070d2f5;
  }
  GlobalTypeRewriter::GlobalTypeRewriter
            ((GlobalTypeRewriter *)
             &functionSetGetInfos.
              super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
              ._M_h._M_single_bucket,module);
  functionSetGetInfos.
  super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
  ._M_h._M_single_bucket = (__node_base_ptr)&PTR__GlobalTypeRewriter_00d73bf0;
  local_1d0.stack.fixed._M_elems[2].currp = (Expression **)p_Var40;
  GlobalTypeRewriter::update
            ((GlobalTypeRewriter *)
             &functionSetGetInfos.
              super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
              ._M_h._M_single_bucket);
  GlobalTypeRewriter::~GlobalTypeRewriter
            ((GlobalTypeRewriter *)
             &functionSetGetInfos.
              super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
              ._M_h._M_single_bucket);
  pMVar29 = module;
  p_Var16 = (_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>,_true>_>_>
             *)subs.
               super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
               ._M_h._M_bucket_count;
joined_r0x0070d2f5:
  while (p_Var16 !=
         (_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>,_true>_>_>
          *)0x0) {
    p_Var14 = *(_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>,_true>_>_>
                **)p_Var16;
    std::__detail::
    _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>,_true>_>_>
    ::_M_deallocate_node(p_Var16,(__node_ptr)pMVar29);
    p_Var16 = p_Var14;
  }
  __n = (__node_ptr)0x0;
  memset((void *)local_f0,0,
         (long)subs.
               super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
               ._M_h._M_buckets << 3);
  subs.
  super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
  ._M_h._M_bucket_count = 0;
  subs.
  super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
  ._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  p_Var16 = (_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>,_true>_>_>
             *)subSupers.
               super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
               ._M_h._M_bucket_count;
  if ((undefined1  [8])
      &subs.
       super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
       ._M_h._M_rehash_policy._M_next_resize != local_f0) {
    __n = (__node_ptr)
          ((long)subs.
                 super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
                 ._M_h._M_buckets << 3);
    operator_delete((void *)local_f0,(ulong)__n);
    p_Var16 = (_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>,_true>_>_>
               *)subSupers.
                 super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
                 ._M_h._M_bucket_count;
  }
  while (p_Var16 !=
         (_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>,_true>_>_>
          *)0x0) {
    p_Var14 = *(_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>,_true>_>_>
                **)p_Var16;
    std::__detail::
    _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>,_true>_>_>
    ::_M_deallocate_node(p_Var16,__n);
    p_Var16 = p_Var14;
  }
  p_Var30 = (__node_ptr)0x0;
  memset((void *)local_90,0,
         (long)subSupers.
               super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
               ._M_h._M_buckets << 3);
  subSupers.
  super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
  ._M_h._M_bucket_count = 0;
  subSupers.
  super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
  ._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  if ((undefined1  [8])
      &subSupers.
       super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
       ._M_h._M_rehash_policy._M_next_resize != local_90) {
    p_Var30 = (__node_ptr)
              ((long)subSupers.
                     super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
                     ._M_h._M_buckets << 3);
    operator_delete((void *)local_90,(ulong)p_Var30);
  }
  std::
  _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&propagator.subTypes.types.
                    super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
  if (functionNewInfos.
      super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
      ._M_h._M_single_bucket != (__node_base_ptr)0x0) {
    p_Var30 = (__node_ptr)
              ((long)propagator.subTypes.types.
                     super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                     super__Vector_impl_data._M_finish -
              (long)functionNewInfos.
                    super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
                    ._M_h._M_single_bucket);
    operator_delete(functionNewInfos.
                    super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
                    ._M_h._M_single_bucket,(ulong)p_Var30);
  }
  if (local_418.stack.flexible.
      super__Vector_base<wasm::Walker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task,_std::allocator<wasm::Walker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    p_Var30 = (__node_ptr)
              ((long)local_418.stack.flexible.
                     super__Vector_base<wasm::Walker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task,_std::allocator<wasm::Walker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage -
              (long)local_418.stack.flexible.
                    super__Vector_base<wasm::Walker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task,_std::allocator<wasm::Walker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task>_>
                    ._M_impl.super__Vector_impl_data._M_start);
    operator_delete(local_418.stack.flexible.
                    super__Vector_base<wasm::Walker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task,_std::allocator<wasm::Walker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task>_>
                    ._M_impl.super__Vector_impl_data._M_start,(ulong)p_Var30);
  }
  local_448._0_8_ = &PTR__Pass_00d722d8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_438._M_p != &local_428) {
    p_Var30 = (__node_ptr)
              (CONCAT71(local_428._M_allocated_capacity._1_7_,local_428._M_local_buf[0]) + 1);
    operator_delete(local_438._M_p,(ulong)p_Var30);
  }
  while ((_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>_>,_false>_>_>
          *)functionSetGetInfos.
            super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
            ._M_h._M_bucket_count !=
         (_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>_>,_false>_>_>
          *)0x0) {
    p_Var15 = *(_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>_>,_false>_>_>
                **)functionSetGetInfos.
                   super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
                   ._M_h._M_bucket_count;
    std::__detail::
    _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>_>,_false>_>_>
    ::_M_deallocate_node
              ((_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>_>,_false>_>_>
                *)functionSetGetInfos.
                  super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
                  ._M_h._M_bucket_count,p_Var30);
    functionSetGetInfos.
    super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
    ._M_h._M_bucket_count = (size_type)p_Var15;
  }
  p_Var30 = (__node_ptr)0x0;
  memset(propagator.subTypes.typeSubTypes._M_h._M_single_bucket,0,
         (long)functionSetGetInfos.
               super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
               ._M_h._M_buckets << 3);
  functionSetGetInfos.
  super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
  ._M_h._M_bucket_count = 0;
  functionSetGetInfos.
  super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
  ._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  if ((__node_base_ptr)
      &functionSetGetInfos.
       super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
       ._M_h._M_rehash_policy._M_next_resize !=
      propagator.subTypes.typeSubTypes._M_h._M_single_bucket) {
    p_Var30 = (__node_ptr)
              ((long)functionSetGetInfos.
                     super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
                     ._M_h._M_buckets << 3);
    operator_delete(propagator.subTypes.typeSubTypes._M_h._M_single_bucket,(ulong)p_Var30);
  }
  while ((_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>_>,_false>_>_>
          *)functionNewInfos.
            super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
            ._M_h._M_bucket_count !=
         (_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>_>,_false>_>_>
          *)0x0) {
    p_Var15 = *(_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>_>,_false>_>_>
                **)functionNewInfos.
                   super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
                   ._M_h._M_bucket_count;
    std::__detail::
    _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>_>,_false>_>_>
    ::_M_deallocate_node
              ((_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>_>,_false>_>_>
                *)functionNewInfos.
                  super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
                  ._M_h._M_bucket_count,p_Var30);
    functionNewInfos.
    super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
    ._M_h._M_bucket_count = (size_type)p_Var15;
  }
  memset((void *)local_2c0,0,
         (long)functionNewInfos.
               super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
               ._M_h._M_buckets << 3);
  functionNewInfos.
  super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
  ._M_h._M_bucket_count = 0;
  functionNewInfos.
  super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
  ._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  if ((undefined1  [8])
      &functionNewInfos.
       super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
       ._M_h._M_rehash_policy._M_next_resize != local_2c0) {
    operator_delete((void *)local_2c0,
                    (long)functionNewInfos.
                          super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
                          ._M_h._M_buckets << 3);
  }
  return;
}

Assistant:

void run(Module* module) override {
    if (!module->features.hasGC()) {
      return;
    }

    if (!getPassOptions().closedWorld) {
      Fatal() << "GTO requires --closed-world";
    }

    // Find and analyze struct operations inside each function.
    StructUtils::FunctionStructValuesMap<FieldInfo> functionNewInfos(*module),
      functionSetGetInfos(*module);
    FieldInfoScanner scanner(functionNewInfos, functionSetGetInfos);
    scanner.run(getPassRunner(), module);
    scanner.runOnModuleCode(getPassRunner(), module);

    // Combine the data from the functions.
    functionSetGetInfos.combineInto(combinedSetGetInfos);
    // TODO: combine newInfos as well, once we have a need for that (we will
    //       when we do things like subtyping).

    // Propagate information to super and subtypes on set/get infos:
    //
    //  * For removing unread fields, we can only remove a field if it is never
    //    read in any sub or supertype, as such a read may alias any of those
    //    types (where the field is present).
    //
    //    Note that we *can* propagate reads only to supertypes, but we are
    //    limited in what we optimize. If type A has fields {a, b}, and its
    //    subtype B has the same fields, and if field a is only used in reads of
    //    type B, then we still cannot remove it. If we removed it then A would
    //    have fields {b}, that is, field b would be at index 0, while type B
    //    would still be {a, b} which has field b at index 1, which is not
    //    compatible. The only case in which we can optimize is to remove a
    //    field from the end, that is, we could remove field b from A.
    //    Otherwise, as mentioned before we can only remove a field if we also
    //    remove it from all sub- and super-types.
    //
    //  * For immutability, this is necessary because we cannot have a
    //    supertype's field be immutable while a subtype's is not - they must
    //    match for us to preserve subtyping.
    //
    //    Note that we do not need to care about types here: If the fields were
    //    mutable before, then they must have had identical types for them to be
    //    subtypes (as wasm only allows the type to differ if the fields are
    //    immutable). Note that by making more things immutable we therefore
    //    make it possible to apply more specific subtypes in subtype fields.
    StructUtils::TypeHierarchyPropagator<FieldInfo> propagator(*module);
    auto subSupers = combinedSetGetInfos;
    propagator.propagateToSuperAndSubTypes(subSupers);
    auto subs = std::move(combinedSetGetInfos);
    propagator.propagateToSubTypes(subs);

    // Process the propagated info.
    for (auto type : propagator.subTypes.types) {
      if (!type.isStruct()) {
        continue;
      }
      auto& fields = type.getStruct().fields;
      auto& subSuper = subSupers[type];
      auto& sub = subs[type];

      // Process immutability.
      for (Index i = 0; i < fields.size(); i++) {
        if (fields[i].mutable_ == Immutable) {
          // Already immutable; nothing to do.
          continue;
        }

        if (subSuper[i].hasWrite) {
          // A set exists.
          continue;
        }

        // No set exists. Mark it as something we can make immutable.
        auto& vec = canBecomeImmutable[type];
        vec.resize(i + 1);
        vec[i] = true;
      }

      // Process removability. We check separately for the ability to
      // remove in a general way based on sub+super-propagated info (that is,
      // fields that are not used in sub- or super-types, and so we can
      // definitely remove them from all the relevant types) and also in the
      // specific way that only works for removing at the end, which as
      // mentioned above only looks at super-types.
      std::set<Index> removableIndexes;
      for (Index i = 0; i < fields.size(); i++) {
        if (!subSuper[i].hasRead) {
          removableIndexes.insert(i);
        }
      }
      for (int i = int(fields.size()) - 1; i >= 0; i--) {
        // Unlike above, a write would stop us here: above we propagated to both
        // sub- and super-types, which means if we see no reads then there is no
        // possible read of the data at all. But here we just propagated to
        // subtypes, and so we need to care about the case where the parent
        // writes to a field but does not read from it - we still need those
        // writes to happen as children may read them. (Note that if no child
        // reads this field, and since we check for reads in parents here, that
        // means the field is not read anywhere at all, and we would have
        // handled that case in the previous loop anyhow.)
        if (!sub[i].hasRead && !sub[i].hasWrite) {
          removableIndexes.insert(i);
        } else {
          // Once we see something we can't remove, we must stop, as we can only
          // remove from the end in this case.
          break;
        }
      }
      if (!removableIndexes.empty()) {
        auto& indexesAfterRemoval = indexesAfterRemovals[type];
        indexesAfterRemoval.resize(fields.size());
        Index skip = 0;
        for (Index i = 0; i < fields.size(); i++) {
          if (!removableIndexes.count(i)) {
            indexesAfterRemoval[i] = i - skip;
          } else {
            indexesAfterRemoval[i] = RemovedField;
            skip++;
          }
        }
      }
    }

    // If we found fields that can be removed, remove them from instructions.
    // (Note that we must do this first, while we still have the old heap types
    // that we can identify, and only after this should we update all the types
    // throughout the module.)
    if (!indexesAfterRemovals.empty()) {
      removeFieldsInInstructions(*module);
    }

    // Update the types in the entire module.
    if (!indexesAfterRemovals.empty() || !canBecomeImmutable.empty()) {
      updateTypes(*module);
    }
  }